

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

size_t mpack_node_enum_optional(mpack_node_t node,char **strings,size_t count)

{
  char *__s;
  int iVar1;
  char *__s1;
  size_t __n;
  size_t sVar2;
  size_t i;
  size_t sVar3;
  
  if (((node.tree)->error == mpack_ok) && ((node.data)->type == mpack_type_str)) {
    __s1 = mpack_node_str(node);
    __n = mpack_node_strlen(node);
    for (sVar3 = 0; count != sVar3; sVar3 = sVar3 + 1) {
      __s = strings[sVar3];
      sVar2 = strlen(__s);
      if ((__n == sVar2) && (iVar1 = bcmp(__s1,__s,__n), iVar1 == 0)) {
        return sVar3;
      }
    }
  }
  return count;
}

Assistant:

size_t mpack_node_enum_optional(mpack_node_t node, const char* strings[], size_t count) {
    if (mpack_node_error(node) != mpack_ok)
        return count;

    // the value is only recognized if it is a string
    if (mpack_node_type(node) != mpack_type_str)
        return count;

    // fetch the string
    const char* key = mpack_node_str(node);
    size_t keylen = mpack_node_strlen(node);
    mpack_assert(mpack_node_error(node) == mpack_ok, "these should not fail");

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    return count;
}